

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgSphere.cpp
# Opt level: O1

void __thiscall
dgSphere::SetDimensions
          (dgSphere *this,HaF32 *vertex,HaI32 strideInBytes,HaI32 count,dgMatrix *basis)

{
  dgTemplateVector<float> dVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined8 uVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  float *pfVar8;
  int i;
  int iVar9;
  HaF32 HVar10;
  uint uVar11;
  int stride;
  int iVar12;
  HaF32 *pHVar13;
  int i_00;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar20;
  float fVar21;
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [16];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  float fVar27;
  undefined1 auVar28 [64];
  float fVar29;
  undefined1 auVar30 [64];
  undefined1 auVar31 [16];
  dgVector scaleVector;
  dgVector eigen;
  dgTemplateVector<float> local_50;
  dgTemplateVector<float> local_40;
  
  local_50 = _DAT_00a025b0;
  stride = strideInBytes >> 2;
  if (basis == (dgMatrix *)0x0) {
    InternalSphere::Statistics(this,(dgVector *)&local_40,(dgVector *)&local_50,vertex,count,stride)
    ;
    iVar12 = 0;
    i = 0;
    do {
      iVar9 = 2;
      if (2 < i) {
        iVar9 = i;
      }
      i_00 = i;
      do {
        i_00 = i_00 + 1;
        if (i_00 - iVar9 == 1) goto LAB_008779eb;
        pfVar8 = dgTemplateVector<float>::operator[](&local_40,i);
        fVar20 = *pfVar8;
        pfVar8 = dgTemplateVector<float>::operator[](&local_40,i_00);
        fVar15 = *pfVar8;
        auVar19._0_8_ = (ulong)(uint)fVar20 ^ 0x8000000080000000;
        auVar19._8_4_ = 0x80000000;
        auVar19._12_4_ = 0x80000000;
        uVar5 = vcmpss_avx512f(auVar19,ZEXT416((uint)fVar20),2);
        bVar6 = (bool)((byte)uVar5 & 1);
        auVar31._4_12_ = auVar19._4_12_;
        auVar31._0_4_ = (uint)bVar6 * (int)fVar20 + (uint)!bVar6 * (int)-fVar20;
        auVar16._0_4_ = -fVar15;
        auVar16._4_4_ = 0x80000000;
        auVar16._8_4_ = 0x80000000;
        auVar16._12_4_ = 0x80000000;
        uVar5 = vcmpss_avx512f(auVar16,ZEXT416((uint)fVar15),2);
        bVar6 = (bool)((byte)uVar5 & 1);
        auVar18._4_12_ = auVar16._4_12_;
        auVar18._0_4_ = (uint)bVar6 * (int)fVar15 + (uint)!bVar6 * (int)auVar16._0_4_;
        auVar19 = vmaxss_avx(auVar31,auVar18);
        auVar31 = vminss_avx(auVar18,auVar31);
        fVar20 = auVar19._0_4_;
      } while (auVar31._0_4_ /
               (float)((uint)(fVar20 < 1e-12) * 0x2b8cbccc + (uint)(fVar20 >= 1e-12) * (int)fVar20)
               <= 0.9);
      pfVar8 = dgTemplateVector<float>::operator[](&local_50,i);
      *pfVar8 = *pfVar8 + *pfVar8;
      InternalSphere::Statistics
                (this,(dgVector *)&local_40,(dgVector *)&local_50,vertex,count,stride);
      iVar12 = iVar12 + 1;
      i = -1;
LAB_008779eb:
    } while ((i < 2) && (i = i + 1, iVar12 < 6));
  }
  else {
    fVar20 = (basis->m_front).super_dgTemplateVector<float>.m_y;
    fVar15 = (basis->m_front).super_dgTemplateVector<float>.m_z;
    fVar27 = (basis->m_front).super_dgTemplateVector<float>.m_w;
    (this->super_dgMatrix).m_front.super_dgTemplateVector<float>.m_x =
         (basis->m_front).super_dgTemplateVector<float>.m_x;
    (this->super_dgMatrix).m_front.super_dgTemplateVector<float>.m_y = fVar20;
    (this->super_dgMatrix).m_front.super_dgTemplateVector<float>.m_z = fVar15;
    (this->super_dgMatrix).m_front.super_dgTemplateVector<float>.m_w = fVar27;
    fVar20 = (basis->m_up).super_dgTemplateVector<float>.m_y;
    fVar15 = (basis->m_up).super_dgTemplateVector<float>.m_z;
    fVar27 = (basis->m_up).super_dgTemplateVector<float>.m_w;
    (this->super_dgMatrix).m_up.super_dgTemplateVector<float>.m_x =
         (basis->m_up).super_dgTemplateVector<float>.m_x;
    (this->super_dgMatrix).m_up.super_dgTemplateVector<float>.m_y = fVar20;
    (this->super_dgMatrix).m_up.super_dgTemplateVector<float>.m_z = fVar15;
    (this->super_dgMatrix).m_up.super_dgTemplateVector<float>.m_w = fVar27;
    fVar20 = (basis->m_right).super_dgTemplateVector<float>.m_y;
    fVar15 = (basis->m_right).super_dgTemplateVector<float>.m_z;
    fVar27 = (basis->m_right).super_dgTemplateVector<float>.m_w;
    (this->super_dgMatrix).m_right.super_dgTemplateVector<float>.m_x =
         (basis->m_right).super_dgTemplateVector<float>.m_x;
    (this->super_dgMatrix).m_right.super_dgTemplateVector<float>.m_y = fVar20;
    (this->super_dgMatrix).m_right.super_dgTemplateVector<float>.m_z = fVar15;
    (this->super_dgMatrix).m_right.super_dgTemplateVector<float>.m_w = fVar27;
    fVar20 = (basis->m_posit).super_dgTemplateVector<float>.m_y;
    fVar15 = (basis->m_posit).super_dgTemplateVector<float>.m_z;
    fVar27 = (basis->m_posit).super_dgTemplateVector<float>.m_w;
    (this->super_dgMatrix).m_posit.super_dgTemplateVector<float>.m_x =
         (basis->m_posit).super_dgTemplateVector<float>.m_x;
    (this->super_dgMatrix).m_posit.super_dgTemplateVector<float>.m_y = fVar20;
    (this->super_dgMatrix).m_posit.super_dgTemplateVector<float>.m_z = fVar15;
    (this->super_dgMatrix).m_posit.super_dgTemplateVector<float>.m_w = fVar27;
  }
  if (count < 1) {
    auVar26 = ZEXT464(0xd01502f9);
    auVar25 = ZEXT464(0x501502f9);
    auVar30 = ZEXT1664(auVar26._0_16_);
    auVar22 = ZEXT1664(auVar26._0_16_);
    auVar28 = ZEXT1664(auVar25._0_16_);
    auVar23 = ZEXT1664(auVar25._0_16_);
  }
  else {
    pHVar13 = vertex + 2;
    auVar22 = ZEXT464(0xd01502f9);
    auVar23 = ZEXT464(0x501502f9);
    auVar28 = ZEXT1664(auVar23._0_16_);
    auVar30 = ZEXT1664(auVar22._0_16_);
    auVar26 = ZEXT1664(auVar22._0_16_);
    auVar25 = ZEXT1664(auVar23._0_16_);
    do {
      auVar31 = ZEXT416((uint)pHVar13[-2]);
      HVar10 = (HaF32)ABS((float)*pHVar13);
      auVar19 = vucomiss_avx512f(ZEXT416((uint)*pHVar13));
      if (((((POPCOUNT((int)HVar10 + 0x80800000U & 0xff) & 1U) == 0) || (0x7f7fffff < (uint)HVar10))
          || (auVar18 = vucomiss_avx512f(ZEXT416((uint)pHVar13[-1])), 0x7f7fffff >= (uint)HVar10))
         || ((0x7f7fffff < (uint)ABS((float)pHVar13[-2]) ||
             (0x7f7fffff < (uint)ABS((float)pHVar13[-1]))))) goto LAB_00877f58;
      auVar16 = vmulss_avx512f(ZEXT416((uint)(this->super_dgMatrix).m_front.
                                             super_dgTemplateVector<float>.m_y),auVar18);
      auVar16 = vfmadd231ss_avx512f(auVar16,auVar31,
                                    ZEXT416((uint)(this->super_dgMatrix).m_front.
                                                  super_dgTemplateVector<float>.m_x));
      auVar16 = vfmadd231ss_avx512f(auVar16,auVar19,
                                    ZEXT416((uint)(this->super_dgMatrix).m_front.
                                                  super_dgTemplateVector<float>.m_z));
      auVar17 = vmulss_avx512f(ZEXT416((uint)(this->super_dgMatrix).m_up.
                                             super_dgTemplateVector<float>.m_y),auVar18);
      auVar17 = vfmadd231ss_avx512f(auVar17,auVar31,
                                    ZEXT416((uint)(this->super_dgMatrix).m_up.
                                                  super_dgTemplateVector<float>.m_x));
      auVar17 = vfmadd231ss_avx512f(auVar17,auVar19,
                                    ZEXT416((uint)(this->super_dgMatrix).m_up.
                                                  super_dgTemplateVector<float>.m_z));
      auVar18 = vmulss_avx512f(ZEXT416((uint)(this->super_dgMatrix).m_right.
                                             super_dgTemplateVector<float>.m_y),auVar18);
      auVar31 = vfmadd231ss_avx512f(auVar18,ZEXT416((uint)(this->super_dgMatrix).m_right.
                                                          super_dgTemplateVector<float>.m_x),auVar31
                                   );
      auVar19 = vfmadd231ss_avx512f(auVar31,ZEXT416((uint)(this->super_dgMatrix).m_right.
                                                          super_dgTemplateVector<float>.m_z),auVar19
                                   );
      uVar11 = auVar19._0_4_ & 0x7fffffff;
      auVar19 = vucomiss_avx512f(auVar19);
      if (((((POPCOUNT(uVar11 + 0x80800000 & 0xff) & 1U) == 0) ||
           ((0x7f7fffff < uVar11 || (auVar31 = vucomiss_avx512f(auVar17), 0x7f7fffff >= uVar11))))
          || (0x7f7fffff < (auVar16._0_4_ & 0x7fffffff))) ||
         (0x7f7fffff < (auVar17._0_4_ & 0x7fffffff))) goto LAB_00877f58;
      auVar18 = vminss_avx(auVar16,auVar23._0_16_);
      auVar23 = ZEXT1664(auVar18);
      auVar18 = vminss_avx512f(auVar31,auVar28._0_16_);
      auVar28 = ZEXT1664(auVar18);
      auVar18 = vminss_avx512f(auVar19,auVar25._0_16_);
      auVar25 = ZEXT1664(auVar18);
      auVar18 = vmaxss_avx(auVar16,auVar26._0_16_);
      auVar26 = ZEXT1664(auVar18);
      auVar31 = vmaxss_avx512f(auVar31,auVar30._0_16_);
      auVar30 = ZEXT1664(auVar31);
      auVar19 = vmaxss_avx512f(auVar19,auVar22._0_16_);
      auVar22 = ZEXT1664(auVar19);
      pHVar13 = pHVar13 + stride;
      count = count + -1;
    } while (count != 0);
  }
  fVar20 = auVar23._0_4_;
  fVar27 = auVar28._0_4_;
  fVar15 = auVar25._0_4_;
  if ((((!NAN(fVar15)) && ((uint)ABS(fVar15) < 0x7f800000)) && (!NAN(fVar27))) &&
     (((uint)ABS(fVar27) < 0x7f800000 && ((uint)ABS(fVar20) < 0x7f800000)))) {
    fVar14 = auVar26._0_4_;
    fVar29 = auVar30._0_4_;
    fVar21 = auVar22._0_4_;
    if (((!NAN(fVar21)) && (((uint)ABS(fVar21) < 0x7f800000 && (!NAN(fVar29))))) &&
       (((uint)ABS(fVar14) < 0x7f800000 && ((uint)ABS(fVar29) < 0x7f800000)))) {
      if ((((uint)ABS(fVar14 + fVar20) < 0x7f800000) && ((uint)ABS(fVar29 + fVar27) < 0x7f800000))
         && ((uint)ABS(fVar15 + fVar21) < 0x7f800000)) {
        fVar2 = (fVar14 + fVar20) * 0.5;
        fVar3 = (fVar29 + fVar27) * 0.5;
        fVar4 = (fVar15 + fVar21) * 0.5;
        if ((((uint)ABS(fVar2) < 0x7f800000) && ((uint)ABS(fVar3) < 0x7f800000)) &&
           ((uint)ABS(fVar4) < 0x7f800000)) {
          auVar31 = ZEXT416((uint)fVar2);
          auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * (this->super_dgMatrix).m_up.
                                                           super_dgTemplateVector<float>.m_x)),
                                    auVar31,ZEXT416((uint)(this->super_dgMatrix).m_front.
                                                          super_dgTemplateVector<float>.m_x));
          auVar18 = ZEXT416((uint)fVar4);
          auVar19 = vfmadd231ss_fma(auVar19,auVar18,
                                    ZEXT416((uint)(this->super_dgMatrix).m_right.
                                                  super_dgTemplateVector<float>.m_x));
          fVar2 = auVar19._0_4_ + (this->super_dgMatrix).m_posit.super_dgTemplateVector<float>.m_x;
          auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * (this->super_dgMatrix).m_up.
                                                           super_dgTemplateVector<float>.m_y)),
                                    auVar31,ZEXT416((uint)(this->super_dgMatrix).m_front.
                                                          super_dgTemplateVector<float>.m_y));
          auVar19 = vfmadd231ss_fma(auVar19,auVar18,
                                    ZEXT416((uint)(this->super_dgMatrix).m_right.
                                                  super_dgTemplateVector<float>.m_y));
          fVar4 = auVar19._0_4_ + (this->super_dgMatrix).m_posit.super_dgTemplateVector<float>.m_y;
          auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * (this->super_dgMatrix).m_up.
                                                           super_dgTemplateVector<float>.m_z)),
                                    auVar31,ZEXT416((uint)(this->super_dgMatrix).m_front.
                                                          super_dgTemplateVector<float>.m_z));
          auVar19 = vfmadd231ss_fma(auVar19,auVar18,
                                    ZEXT416((uint)(this->super_dgMatrix).m_right.
                                                  super_dgTemplateVector<float>.m_z));
          fVar3 = auVar19._0_4_ + (this->super_dgMatrix).m_posit.super_dgTemplateVector<float>.m_z;
          if (((NAN(fVar3)) || (NAN(fVar4))) ||
             ((0x7f7fffff < (uint)ABS(fVar2) ||
              ((0x7f7fffff < (uint)ABS(fVar4) || (0x7f7fffff < (uint)ABS(fVar3)))))))
          goto LAB_00877f58;
          auVar19 = vinsertps_avx(ZEXT416((uint)fVar2),ZEXT416((uint)fVar4),0x10);
          dVar1 = (dgTemplateVector<float>)vinsertps_avx(auVar19,ZEXT416((uint)fVar3),0x28);
          (this->super_dgMatrix).m_posit.super_dgTemplateVector<float> = dVar1;
          if (((uint)ABS(fVar14 - fVar20) < 0x7f800000) &&
             (((uint)ABS(fVar29 - fVar27) < 0x7f800000 && ((uint)ABS(fVar21 - fVar15) < 0x7f800000))
             )) {
            fVar20 = (fVar14 - fVar20) * 0.5;
            fVar27 = (fVar29 - fVar27) * 0.5;
            fVar15 = (fVar21 - fVar15) * 0.5;
            if (((uint)ABS(fVar20) < 0x7f800000) &&
               (((uint)ABS(fVar27) < 0x7f800000 && ((uint)ABS(fVar15) < 0x7f800000)))) {
              fVar20 = fVar20 + 0.002;
              fVar27 = fVar27 + 0.002;
              fVar15 = fVar15 + 0.002;
              auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar27 * fVar27)),ZEXT416((uint)fVar20),
                                        ZEXT416((uint)fVar20));
              auVar19 = vfmadd231ss_fma(auVar19,ZEXT416((uint)fVar15),ZEXT416((uint)fVar15));
              if (auVar19._0_4_ < 0.0) {
                fVar21 = sqrtf(auVar19._0_4_);
              }
              else {
                auVar19 = vsqrtss_avx(auVar19,auVar19);
                fVar21 = auVar19._0_4_;
              }
              if (!NAN(fVar21)) {
                auVar17._0_8_ = (ulong)(uint)fVar15 ^ 0x8000000080000000;
                auVar17._8_4_ = 0x80000000;
                auVar17._12_4_ = 0x80000000;
                uVar5 = vcmpss_avx512f(auVar17,ZEXT416((uint)fVar15),2);
                bVar6 = (bool)((byte)uVar5 & 1);
                fVar14 = (float)((uint)bVar6 * (int)fVar15 + (uint)!bVar6 * (int)-fVar15);
                if ((!NAN(fVar14)) && ((uint)ABS(fVar15) < 0x7f800000)) {
                  auVar24._0_8_ = (ulong)(uint)fVar27 ^ 0x8000000080000000;
                  auVar24._8_4_ = 0x80000000;
                  auVar24._12_4_ = 0x80000000;
                  uVar5 = vcmpss_avx512f(auVar24,ZEXT416((uint)fVar27),2);
                  bVar6 = (bool)((byte)uVar5 & 1);
                  fVar15 = (float)((uint)bVar6 * (int)fVar27 + (uint)!bVar6 * (int)-fVar27);
                  if ((!NAN(fVar15)) &&
                     ((((uint)ABS(fVar27) < 0x7f800000 && ((uint)ABS(fVar20) < 0x7f800000)) &&
                      ((uint)ABS(fVar21) < 0x7f800000)))) {
                    auVar7._8_4_ = 0x80000000;
                    auVar7._0_8_ = 0x8000000080000000;
                    auVar7._12_4_ = 0x80000000;
                    auVar19 = vxorps_avx512vl(ZEXT416((uint)fVar20),auVar7);
                    uVar5 = vcmpss_avx512f(auVar19,ZEXT416((uint)fVar20),2);
                    bVar6 = (bool)((byte)uVar5 & 1);
                    (this->m_size).super_dgTemplateVector<float>.m_x =
                         (float)((uint)bVar6 * (int)fVar20 + (uint)!bVar6 * auVar19._0_4_);
                    (this->m_size).super_dgTemplateVector<float>.m_y = fVar15;
                    (this->m_size).super_dgTemplateVector<float>.m_z = fVar14;
                    (this->m_size).super_dgTemplateVector<float>.m_w = fVar21;
                    return;
                  }
                }
              }
              goto LAB_00877f58;
            }
          }
        }
      }
      __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                    ,0x121,"dgVector::dgVector(const dgTemplateVector<hacd::HaF32> &)");
    }
  }
LAB_00877f58:
  __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                ,0x134,"dgVector::dgVector(hacd::HaF32, hacd::HaF32, hacd::HaF32, hacd::HaF32)");
}

Assistant:

void dgSphere::SetDimensions (const hacd::HaF32 vertex[], hacd::HaI32 strideInBytes, hacd::HaI32 count, const dgMatrix *basis) 
{
	dgVector eigen;
	dgVector scaleVector (hacd::HaF32(1.0f), hacd::HaF32(1.0f), hacd::HaF32(1.0f), hacd::HaF32 (0.0f));

	hacd::HaI32 stride = hacd::HaI32 (strideInBytes / sizeof (hacd::HaF32));
	if (!basis)	{
		InternalSphere::Statistics (*this, eigen, scaleVector, vertex, count, stride);

		hacd::HaI32 k = 0;
		for (hacd::HaI32 i = 0; i < 3; i ++) {
			if (k >= 6) {
				 break;
			}
			for (hacd::HaI32 j = i + 1; j < 3; j ++) {
				hacd::HaF32 aspect = InternalSphere::AspectRatio (eigen[i], eigen[j]);
				if (aspect > hacd::HaF32 (0.9f)) {
					scaleVector[i] *= hacd::HaF32 (2.0f); 
					InternalSphere::Statistics (*this, eigen, scaleVector, vertex, count, stride);
					k ++;
					i = -1;
					break;
				}
			}
		}
	} else {
		*this = *basis;
	}
		
   dgVector min; 
   dgVector max;
   InternalSphere::BoundingBox (*this, vertex, count, stride, min, max);

	dgVector massCenter (max + min);
	massCenter = massCenter.Scale (0.5);
	m_posit = TransformVector (massCenter);

	dgVector dim (max - min);
	dim = dim.Scale (hacd::HaF32(0.5f));
	SetDimensions (dim.m_x + InternalSphere::SPHERE_TOL, 
				   dim.m_y + InternalSphere::SPHERE_TOL, 
				   dim.m_z + InternalSphere::SPHERE_TOL);

}